

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdEmuD3D0Config::emulate_mthd(MthdEmuD3D0Config *this)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  iVar4 = ((uVar2 & 0xf) == 2) + 1;
  uVar3 = uVar2 >> 4 & 3;
  uVar8 = uVar2 >> 6 & 3;
  uVar5 = 0x9000000;
  if (uVar3 != 0) {
    uVar5 = uVar3 << 0x18;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc32[3] = uVar2;
  uVar3 = *(uint *)(&DAT_002e2140 + (uVar2 >> 10 & 0xc));
  uVar7 = 0x90000000;
  if (uVar8 != 0) {
    uVar7 = uVar8 << 0x1c;
  }
  lVar6 = 0;
  do {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[lVar6] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[lVar6] &
         0xffffcf | uVar5 | (uint)((uVar2 & 0xf) == 0) << 5 | uVar7;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[lVar6] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[lVar6] &
         0x88ffffff | iVar4 * 0x10000000 | iVar4 * 0x1000000;
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  uVar8 = ((uVar2 & 0x20000000) >> 3) + 0x5110190;
  uVar5 = 0xa0000000;
  if ((uVar2 & 0x20000000) == 0) {
    uVar5 = 0x60000000;
  }
  if ((uVar2 >> 0x1c & 1) != 0) {
    uVar5 = 0x20000000;
    uVar8 = 0x2110190;
  }
  uVar7 = 0x10000000;
  if ((uVar2 >> 0x1e & 1) == 0) {
    uVar7 = uVar5;
  }
  uVar5 = 0x1110190;
  if (-1 < (int)uVar2) {
    uVar5 = uVar8;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend =
       uVar5 | uVar7 |
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend & 0xeeee0f;
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar5 = (uint)((uVar2 & 0x700000) != 0);
  uVar8 = 0x38000000;
  if ((uVar2 & 0x7000000) == 0) {
    uVar8 = 0;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       uVar8 | uVar5 << 0x18 |
       uVar3 | (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xbfff
       | uVar2 & 0xf0000 | (uVar2 & 0x8000) << 8 | uVar5 << 0xe;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_stencil_func = 0x80;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_stencil_op = 0x222;
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
  *puVar1 = *puVar1 | 0x1020000;
  return;
}

Assistant:

void emulate_mthd() override {
		exp.misc32[3] = val;
		int filt = 1;
		int origin = 0;
		int sinterp = extr(val, 0, 4);
		if (sinterp == 0)
			origin = 2;
		if (sinterp == 2)
			filt = 2;
		int wrapu = extr(val, 4, 2);
		if (wrapu == 0)
			wrapu = 9;
		int wrapv = extr(val, 6, 2);
		if (wrapv == 0)
			wrapv = 9;
		int scull = extr(val, 12, 2);
		int cull = 0;
		if (scull == 0) {
			cull = 1;
		} else if (scull == 1) {
			cull = 1;
		} else if (scull == 2) {
			cull = 3;
		} else if (scull == 3) {
			cull = 2;
		}
		int dblend = 6;
		int sblend = 5;
		if (extr(val, 29, 1)) {
			dblend = 0xa;
			sblend = 0x9;
		}
		if (extr(val, 28, 1))
			dblend = sblend = 2;
		if (extr(val, 30, 1))
			dblend = 1;
		if (extr(val, 31, 1))
			sblend = 1;
		for (int i = 0; i < 2; i++) {
			insrt(exp.d3d56_tex_format[i], 4, 2, origin);
			insrt(exp.d3d56_tex_format[i], 24, 4, wrapu);
			insrt(exp.d3d56_tex_format[i], 28, 4, wrapv);
			insrt(exp.d3d56_tex_filter[i], 24, 3, filt);
			insrt(exp.d3d56_tex_filter[i], 28, 3, filt);
		}
		insrt(exp.d3d56_blend, 4, 2, 1);
		insrt(exp.d3d56_blend, 6, 2, 2);
		insrt(exp.d3d56_blend, 8, 1, 1);
		insrt(exp.d3d56_blend, 12, 1, 0);
		insrt(exp.d3d56_blend, 16, 1, 1);
		insrt(exp.d3d56_blend, 20, 1, 1);
		insrt(exp.d3d56_blend, 24, 4, sblend);
		insrt(exp.d3d56_blend, 28, 4, dblend);
		insrt(exp.d3d56_config, 14, 1, !!extr(val, 20, 3));
		insrt(exp.d3d56_config, 16, 4, extr(val, 16, 4));
		insrt(exp.d3d56_config, 20, 2, cull);
		insrt(exp.d3d56_config, 22, 1, 1);
		insrt(exp.d3d56_config, 23, 1, extr(val, 15, 1));
		insrt(exp.d3d56_config, 24, 1, !!extr(val, 20, 3));
		insrt(exp.d3d56_config, 25, 1, 0);
		insrt(exp.d3d56_config, 26, 1, 0);
		insrt(exp.d3d56_config, 27, 3, extr(val, 24, 3) ? 0x7 : 0);
		insrt(exp.d3d56_config, 30, 2, 1);
		exp.d3d56_stencil_func = 0x80;
		exp.d3d56_stencil_op = 0x222;
		insrt(exp.valid[1], 17, 1, 1);
		insrt(exp.valid[1], 24, 1, 1);
	}